

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)1>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)1> *div)

{
  uint32_t *puVar1;
  byte bVar2;
  size_t i;
  uint32_t *puVar3;
  UIntT sum;
  ushort uVar4;
  uint8_t shift;
  uint uVar5;
  int iVar6;
  char cVar7;
  size_t loop;
  long lVar8;
  int32_t xl;
  short sVar9;
  undefined1 auVar10 [64];
  type_pun_vec result;
  undefined1 local_100 [64];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  if ((ulong)vals->_length == 0) {
    auVar10 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    bVar2 = (div->div).denom.more;
    puVar3 = vals->_pData;
    iVar6 = (int)(div->div).denom.magic;
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = bVar2 & 0x1f;
    cVar7 = (char)bVar2 >> 7;
    puVar1 = (uint32_t *)((long)puVar3 + (ulong)vals->_length * 2);
    do {
      lVar8 = 0;
      local_c0 = *(undefined8 *)puVar3;
      uStack_b8 = *(undefined8 *)(puVar3 + 2);
      uStack_b0 = *(undefined8 *)(puVar3 + 4);
      uStack_a8 = *(undefined8 *)(puVar3 + 6);
      uStack_a0 = *(undefined8 *)(puVar3 + 8);
      uStack_98 = *(undefined8 *)(puVar3 + 10);
      uStack_90 = *(undefined8 *)(puVar3 + 0xc);
      uStack_88 = *(undefined8 *)(puVar3 + 0xe);
      do {
        sVar9 = *(short *)((long)&local_c0 + lVar8 * 2);
        sVar9 = (short)((uint)(iVar6 * sVar9) >> 0x10) + sVar9;
        *(ushort *)(local_100 + lVar8 * 2) =
             ((ushort)((int)(short)((sVar9 >> 0xf & (short)(1 << uVar5) - (ushort)(iVar6 == 0)) +
                                   sVar9) >> uVar5) ^ (short)cVar7) - (short)cVar7;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      auVar10 = vpaddw_avx512bw(auVar10,local_100);
      puVar3 = puVar3 + 0x10;
    } while (puVar3 != puVar1);
  }
  local_100 = vmovdqa64_avx512f(auVar10);
  lVar8 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + *(short *)(local_100 + lVar8 * 2);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  return (ulong)uVar4;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}